

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

void __thiscall
ON_ClippingPlane::SetParticipationLists
          (ON_ClippingPlane *this,ON_SimpleArray<ON_UUID_struct> *objectIds,
          ON_SimpleArray<int> *layerIndices,bool isExclusionList)

{
  ON_UUID uuid;
  bool bVar1;
  int iVar2;
  ON_ClippingPlaneData *pOVar3;
  ON_UUID_struct *pOVar4;
  int local_3c;
  int i;
  ON_ClippingPlaneData *data;
  ON_ClippingPlaneData *data_1;
  bool isExclusionList_local;
  ON_SimpleArray<int> *layerIndices_local;
  ON_SimpleArray<ON_UUID_struct> *objectIds_local;
  ON_ClippingPlane *this_local;
  
  if ((((objectIds == (ON_SimpleArray<ON_UUID_struct> *)0x0) ||
       (iVar2 = ON_SimpleArray<ON_UUID_struct>::Count(objectIds), iVar2 < 1)) &&
      ((layerIndices == (ON_SimpleArray<int> *)0x0 ||
       (iVar2 = ON_SimpleArray<int>::Count(layerIndices), iVar2 < 1)))) && (isExclusionList)) {
    pOVar3 = GetClippingPlaneData((this->m_data_store).m_sn);
    if (pOVar3 != (ON_ClippingPlaneData *)0x0) {
      ON_UuidList::Empty(&pOVar3->m_object_id_list);
      ON_SimpleArray<int>::Empty(&pOVar3->m_layer_list);
      pOVar3->m_layer_list_is_sorted = true;
      pOVar3->m_is_exclusion_list = isExclusionList;
      bVar1 = ON_ClippingPlaneData::HasDefaultContent(pOVar3);
      if (bVar1) {
        DeleteClippingPlaneData(&this->m_data_store);
      }
    }
  }
  else {
    pOVar3 = GetClippingPlaneData(&this->m_data_store,true);
    if (pOVar3 != (ON_ClippingPlaneData *)0x0) {
      ON_UuidList::Empty(&pOVar3->m_object_id_list);
      ON_SimpleArray<int>::Empty(&pOVar3->m_layer_list);
      pOVar3->m_layer_list_is_sorted = true;
      if (objectIds != (ON_SimpleArray<ON_UUID_struct> *)0x0) {
        for (local_3c = 0; iVar2 = ON_SimpleArray<ON_UUID_struct>::Count(objectIds),
            local_3c < iVar2; local_3c = local_3c + 1) {
          pOVar4 = ON_SimpleArray<ON_UUID_struct>::operator[](objectIds,local_3c);
          uuid.Data1 = pOVar4->Data1;
          uuid.Data2 = pOVar4->Data2;
          uuid.Data3 = pOVar4->Data3;
          uuid.Data4[0] = pOVar4->Data4[0];
          uuid.Data4[1] = pOVar4->Data4[1];
          uuid.Data4[2] = pOVar4->Data4[2];
          uuid.Data4[3] = pOVar4->Data4[3];
          uuid.Data4[4] = pOVar4->Data4[4];
          uuid.Data4[5] = pOVar4->Data4[5];
          uuid.Data4[6] = pOVar4->Data4[6];
          uuid.Data4[7] = pOVar4->Data4[7];
          ON_UuidList::AddUuid(&pOVar3->m_object_id_list,uuid,true);
        }
      }
      if ((layerIndices != (ON_SimpleArray<int> *)0x0) &&
         (iVar2 = ON_SimpleArray<int>::Count(layerIndices), 0 < iVar2)) {
        pOVar3->m_layer_list_is_sorted = false;
        ON_SimpleArray<int>::operator=(&pOVar3->m_layer_list,layerIndices);
      }
      pOVar3->m_is_exclusion_list = isExclusionList;
    }
  }
  return;
}

Assistant:

void ON_ClippingPlane::SetParticipationLists(const ON_SimpleArray<ON_UUID>* objectIds, const ON_SimpleArray<int>* layerIndices, bool isExclusionList)
{
  if ((nullptr == objectIds || objectIds->Count() < 1) &&
    (nullptr==layerIndices || layerIndices->Count()<1) &&
    isExclusionList)
  {
    // clear any existing list
    ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store.m_sn);
    if (data)
    {
      data->m_object_id_list.Empty();
      data->m_layer_list.Empty();
      data->m_layer_list_is_sorted = true;
      data->m_is_exclusion_list = isExclusionList;
      if (data->HasDefaultContent())
      {
        DeleteClippingPlaneData(m_data_store);
      }
    }
    return;
  }

  ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store, true);
  if (data)
  {
    data->m_object_id_list.Empty();
    data->m_layer_list.Empty();
    data->m_layer_list_is_sorted = true;
    if (objectIds)
    {
      for (int i = 0; i < objectIds->Count(); i++)
      {
        data->m_object_id_list.AddUuid((*objectIds)[i]);
      }
    }
    if (layerIndices && layerIndices->Count() > 0)
    {
      data->m_layer_list_is_sorted = false;
      data->m_layer_list = (*layerIndices);
    }
    data->m_is_exclusion_list = isExclusionList;
  }
}